

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_cluster_on_close(intptr_t uuid,fio_protocol_s *pr_)

{
  int16_t iVar1;
  uint uVar2;
  __pid_t __pid;
  fio_ls_s *local_28;
  fio_ls_s *pos;
  cluster_pr_s *c;
  fio_protocol_s *pr__local;
  intptr_t uuid_local;
  
  if (fio_data->is_worker == '\0') {
    fio_lock(&cluster_data.lock);
    for (local_28 = cluster_data.clients.next; local_28 != &cluster_data.clients;
        local_28 = local_28->next) {
      if (local_28->obj == (void *)uuid) {
        fio_ls_remove(local_28);
        break;
      }
    }
    fio_unlock(&cluster_data.lock);
  }
  else if (((fio_data->active != '\0') && ((int)pr_[3].rsv != 8)) &&
          (iVar1 = fio_is_running(), iVar1 != 0)) {
    if (0 < FIO_LOG_LEVEL) {
      uVar2 = getpid();
      FIO_LOG2STDERR("FATAL: (%d) Parent Process crash detected!",(ulong)uVar2);
    }
    fio_state_callback_force(FIO_CALL_ON_PARENT_CRUSH);
    fio_state_callback_clear(FIO_CALL_ON_PARENT_CRUSH);
    fio_cluster_data_cleanup(1);
    __pid = getpid();
    kill(__pid,2);
  }
  if (pr_[1].on_data != (_func_void_intptr_t_fio_protocol_s_ptr *)0x0) {
    fio_msg_internal_free((fio_msg_internal_s *)pr_[1].on_data);
  }
  pr_[1].on_data = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  fio_sub_hash_free((fio_sub_hash_s *)&pr_[1].on_close);
  fio_cluster_protocol_free(pr_);
  return;
}

Assistant:

static void fio_cluster_on_close(intptr_t uuid, fio_protocol_s *pr_) {
  cluster_pr_s *c = (cluster_pr_s *)pr_;
  if (!fio_data->is_worker) {
    /* a child was lost, respawning is handled elsewhere. */
    fio_lock(&cluster_data.lock);
    FIO_LS_FOR(&cluster_data.clients, pos) {
      if (pos->obj == (void *)uuid) {
        fio_ls_remove(pos);
        break;
      }
    }
    fio_unlock(&cluster_data.lock);
  } else if (fio_data->active) {
    /* no shutdown message received - parent crashed. */
    if (c->type != FIO_CLUSTER_MSG_SHUTDOWN && fio_is_running()) {
      FIO_LOG_FATAL("(%d) Parent Process crash detected!", (int)getpid());
      fio_state_callback_force(FIO_CALL_ON_PARENT_CRUSH);
      fio_state_callback_clear(FIO_CALL_ON_PARENT_CRUSH);
      fio_cluster_data_cleanup(1);
      kill(getpid(), SIGINT);
    }
  }
  if (c->msg)
    fio_msg_internal_free(c->msg);
  c->msg = NULL;
  fio_sub_hash_free(&c->pubsub);
  fio_cluster_protocol_free(c);
  (void)uuid;
}